

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O1

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  size_t sVar1;
  uint32_or_64_or_128_t<unsigned_int> n_1;
  uint uVar2;
  format_decimal_result<char_*> fVar3;
  char acStack_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  if (n < 1000) {
    uVar2 = n % 100;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(n / 100) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    fVar3 = ::fmt::v9::detail::format_decimal<char,unsigned_int>(acStack_38,n,0x15);
    local_20 = fVar3.begin;
    if ((long)(acStack_38 + -(long)local_20) < -0x15) {
      ::fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,
               local_20 + (long)(acStack_38 + -(long)local_20 + 0x15));
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest) {
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000) {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    } else {
        append_int(n, dest);
    }
}